

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mapperTime.c
# Opt level: O3

float Map_TimeCutComputeArrival(Map_Node_t *pNode,Map_Cut_t *pCut,int fPhase,float tWorstLimit)

{
  uint uVar1;
  Map_Super_t *pMVar2;
  Map_Node_t *pMVar3;
  float *pfVar4;
  ulong uVar5;
  bool bVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  pfVar4 = pNode->p->pNodeDelays;
  fVar8 = 0.0;
  fVar7 = 0.0;
  if (pfVar4 != (float *)0x0) {
    fVar7 = pfVar4[pNode->Num];
  }
  pMVar2 = pCut->M[fPhase].pSuperBest;
  uVar1 = pCut->M[fPhase].uPhaseBest;
  pCut->M[fPhase].tArrive.Rise = 0.0;
  pCut->M[fPhase].tArrive.Fall = 0.0;
  pCut->M[fPhase].tArrive.Worst = 3.4028235e+37;
  uVar5 = (ulong)pCut->nLeaves;
  fVar9 = 0.0;
  if (0 < (long)uVar5) {
    pfVar4 = &pMVar2->tDelaysR[uVar5 + 5].Fall;
    fVar10 = 0.0;
    do {
      pMVar3 = pCut->ppLeaves[uVar5 - 1];
      bVar6 = (~uVar1 >> ((uint)(uVar5 - 1) & 0x1f) & 1) != 0;
      if (0.0 < pfVar4[-0x13]) {
        fVar11 = pfVar4[-0x13] + pMVar3->tArrival[bVar6].Rise + fVar7;
        if (tWorstLimit < fVar11) {
          return 3.4028235e+37;
        }
        if (fVar9 < fVar11) {
          pCut->M[fPhase].tArrive.Rise = fVar11;
          fVar9 = fVar11;
        }
      }
      if (0.0 < pfVar4[-0x12]) {
        fVar11 = pfVar4[-0x12] + pMVar3->tArrival[bVar6].Fall + fVar7;
        if (tWorstLimit < fVar11) {
          return 3.4028235e+37;
        }
        if (fVar9 < fVar11) {
          pCut->M[fPhase].tArrive.Rise = fVar11;
          fVar9 = fVar11;
        }
      }
      if (0.0 < ((Map_Time_t *)(pfVar4 + -1))->Rise) {
        fVar11 = ((Map_Time_t *)(pfVar4 + -1))->Rise + pMVar3->tArrival[bVar6].Rise + fVar7;
        if (tWorstLimit < fVar11) {
          return 3.4028235e+37;
        }
        if (fVar10 < fVar11) {
          pCut->M[fPhase].tArrive.Fall = fVar11;
          fVar8 = fVar11;
          fVar10 = fVar11;
        }
      }
      if (0.0 < *pfVar4) {
        fVar11 = *pfVar4 + pMVar3->tArrival[bVar6].Fall + fVar7;
        if (tWorstLimit < fVar11) {
          return 3.4028235e+37;
        }
        fVar10 = fVar8;
        if (fVar8 < fVar11) {
          pCut->M[fPhase].tArrive.Fall = fVar11;
          fVar8 = fVar11;
          fVar10 = fVar11;
        }
      }
      pfVar4 = pfVar4 + -3;
      bVar6 = 1 < uVar5;
      uVar5 = uVar5 - 1;
    } while (bVar6);
  }
  if (fVar9 <= fVar8) {
    fVar9 = fVar8;
  }
  pCut->M[fPhase].tArrive.Worst = fVar9;
  return fVar9;
}

Assistant:

float Map_TimeCutComputeArrival( Map_Node_t * pNode, Map_Cut_t * pCut, int fPhase, float tWorstLimit )
{
    Map_Match_t * pM = pCut->M + fPhase;
    Map_Super_t * pSuper = pM->pSuperBest;
    unsigned uPhaseTot = pM->uPhaseBest;
    Map_Time_t * ptArrRes = &pM->tArrive;
    Map_Time_t * ptArrIn;
    int fPinPhase;
    float tDelay, tExtra;
    int i;

    tExtra = pNode->p->pNodeDelays ? pNode->p->pNodeDelays[pNode->Num] : 0;
    ptArrRes->Rise  = ptArrRes->Fall = 0.0;
    ptArrRes->Worst = MAP_FLOAT_LARGE;
    for ( i = pCut->nLeaves - 1; i >= 0; i-- )
    {
        // get the phase of the given pin
        fPinPhase = ((uPhaseTot & (1 << i)) == 0);
        ptArrIn = pCut->ppLeaves[i]->tArrival + fPinPhase;

        // get the rise of the output due to rise of the inputs
        if ( pSuper->tDelaysR[i].Rise > 0 )
        {
            tDelay = ptArrIn->Rise + pSuper->tDelaysR[i].Rise + tExtra;
            if ( tDelay > tWorstLimit )
                return MAP_FLOAT_LARGE;
            if ( ptArrRes->Rise < tDelay )
                ptArrRes->Rise = tDelay;
        }

        // get the rise of the output due to fall of the inputs
        if ( pSuper->tDelaysR[i].Fall > 0 )
        {
            tDelay = ptArrIn->Fall + pSuper->tDelaysR[i].Fall + tExtra;
            if ( tDelay > tWorstLimit )
                return MAP_FLOAT_LARGE;
            if ( ptArrRes->Rise < tDelay )
                ptArrRes->Rise = tDelay;
        }

        // get the fall of the output due to rise of the inputs
        if ( pSuper->tDelaysF[i].Rise > 0 )
        {
            tDelay = ptArrIn->Rise + pSuper->tDelaysF[i].Rise + tExtra;
            if ( tDelay > tWorstLimit )
                return MAP_FLOAT_LARGE;
            if ( ptArrRes->Fall < tDelay )
                ptArrRes->Fall = tDelay;
        }

        // get the fall of the output due to fall of the inputs
        if ( pSuper->tDelaysF[i].Fall > 0 )
        {
            tDelay = ptArrIn->Fall + pSuper->tDelaysF[i].Fall + tExtra;
            if ( tDelay > tWorstLimit )
                return MAP_FLOAT_LARGE;
            if ( ptArrRes->Fall < tDelay )
                ptArrRes->Fall = tDelay;
        }
    }
    // return the worst-case of rise/fall arrival times
    ptArrRes->Worst = MAP_MAX(ptArrRes->Rise, ptArrRes->Fall);
    return ptArrRes->Worst;
}